

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O3

void __thiscall RString::Capitalize(RString *this)

{
  char *pcVar1;
  long lVar2;
  byte bVar3;
  byte *pbVar4;
  
  pcVar1 = this->myString;
  if ('\0' < pcVar1[-1]) {
    CloneString(this);
    pcVar1 = this->myString;
  }
  if ((byte)(*pcVar1 + 0x9fU) < 0x1a) {
    *pcVar1 = *pcVar1 + -0x20;
    pcVar1 = this->myString;
  }
  bVar3 = pcVar1[1];
  if (bVar3 != 0) {
    pbVar4 = (byte *)(pcVar1 + 1);
    lVar2 = 2;
    do {
      if ((byte)(bVar3 + 0xbf) < 0x1a) {
        *pbVar4 = bVar3 | 0x20;
        pcVar1 = this->myString;
      }
      pbVar4 = (byte *)(pcVar1 + lVar2);
      bVar3 = pcVar1[lVar2];
      lVar2 = lVar2 + 1;
    } while (bVar3 != 0);
  }
  return;
}

Assistant:

void RString::Capitalize(void)
{
	PrepForMod();
	if(*myString >= 'a' && *myString <= 'z')
		*myString += 'A' - 'a';
	for(int i = 1; *(myString + i) != '\0'; i++)
		if(*(myString + i) >= 'A' && *(myString + i) <= 'Z')
			*(myString + i) += 'a' - 'A';
}